

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spR<PredictionData<double,long>,long>
                 (PredictionData<double,_long> *prediction_data,long *row_st,long *row_end,
                 size_t col_num,size_t lb,size_t ub)

{
  ulong *puVar1;
  long *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  long in_RDI;
  long *in_R8;
  long *in_R9;
  long *search_res;
  long *in_stack_ffffffffffffffc0;
  undefined8 local_8;
  
  if (((in_RDX == in_RSI) || (in_RCX < in_R8)) || (in_R9 < in_RCX)) {
    local_8 = 0.0;
  }
  else {
    puVar1 = (ulong *)std::lower_bound<long_const*,long>(in_R8,in_R9,in_stack_ffffffffffffffc0);
    if ((puVar1 == in_RDX) || ((long *)*puVar1 != in_RCX)) {
      local_8 = 0.0;
    }
    else {
      local_8 = *(double *)
                 (*(long *)(in_RDI + 0x48) + ((long)puVar1 - *(long *)(in_RDI + 0x50) >> 3) * 8);
    }
  }
  return local_8;
}

Assistant:

static inline double extract_spR(const PredictionData &prediction_data,
                                 const sparse_ix *row_st, const sparse_ix *row_end,
                                 size_t col_num, size_t lb, size_t ub) noexcept
{
    if (row_end == row_st || col_num < lb || col_num > ub)
        return 0.;
    const sparse_ix *search_res = std::lower_bound(row_st, row_end, (sparse_ix) col_num);
    if (search_res == row_end || *search_res != (sparse_ix)col_num)
        return 0.;
    else
        return prediction_data.Xr[search_res - prediction_data.Xr_ind];
}